

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall HTTPReplySender::start_thread(HTTPReplySender *this)

{
  OS_Counter *pOVar1;
  vm_obj_id_t vVar2;
  char *str;
  vm_httpreq_cookie *this_00;
  TadsMessageQueue *pTVar3;
  int iVar4;
  char *pcVar5;
  undefined4 extraout_var;
  vm_globalvar_t *pvVar6;
  HTTPReplySenderThread *this_01;
  int in_ECX;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  
  this->vmg = (vm_globals *)0x0;
  pTVar3 = G_net_queue_X;
  this->queue = G_net_queue_X;
  if (pTVar3 != (TadsMessageQueue *)0x0) {
    LOCK();
    pOVar1 = &(pTVar3->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  pcVar5 = this->status;
  this->status = (char *)0x0;
  str = this->cont_type;
  this->cont_type = (char *)0x0;
  this_00 = this->cookies;
  this->cookies = (vm_httpreq_cookie *)0x0;
  this->async = 1;
  pcVar5 = lib_copy_str(pcVar5,this->status_len);
  this->status = pcVar5;
  __fn = (__fn *)this->cont_type_len;
  pcVar5 = lib_copy_str(str,(size_t)__fn);
  this->cont_type = pcVar5;
  if (this_00 != (vm_httpreq_cookie *)0x0) {
    iVar4 = vm_httpreq_cookie::clone(this_00,__fn,__child_stack,in_ECX,in_R8);
    this->cookies = (vm_httpreq_cookie *)CONCAT44(extraout_var,iVar4);
  }
  bodyArg::init_async(this->body);
  pvVar6 = CVmObjTable::create_global_var(&G_obj_table_X);
  this->reqvar = pvVar6;
  vVar2 = this->reqid;
  (pvVar6->val).typ = VM_OBJ;
  (pvVar6->val).val.obj = vVar2;
  this_01 = (HTTPReplySenderThread *)operator_new(0x48);
  HTTPReplySenderThread::HTTPReplySenderThread(this_01,this);
  iVar4 = OS_Thread::launch((OS_Thread *)this_01);
  if (iVar4 == 0) {
    post_done_event(this,0,"unable to launch thread");
  }
  CVmWeakRefable::release_ref((CVmWeakRefable *)this_01);
  return;
}

Assistant:

void start_thread(VMG0_)
    {
        /* save the globals for use in the 'done' event */
        vmg = VMGLOB_ADDR;

        /* remember the net event queue, and record our reference on it */
        if ((queue = G_net_queue) != 0)
            queue->add_ref();

        /* 
         *   remove the original parametres from our member variables before
         *   we set async mode, in case we throw an error in the course of
         *   making copies - we wouldn't want to delete the originals, as
         *   those are owned by the main thread
         */
        const char *ostatus = status; status = 0;
        const char *ocont_type = cont_type; cont_type = 0;
        vm_httpreq_cookie *ocookies = cookies; cookies = 0;

        /* note that we're now in async mode */
        async = TRUE;
        
        /* install copies in our member variables */
        status = lib_copy_str(ostatus, status_len);
        cont_type = lib_copy_str(ocont_type, cont_type_len);
        if (ocookies != 0)
            cookies = ocookies->clone();

        /* initialize async mode in the body object */
        body->init_async(vmg0_);

        /* 
         *   create a global variable for the request object ID, to keep it
         *   around until the request is completed 
         */
        reqvar = G_obj_table->create_global_var();
        reqvar->val.set_obj(reqid);

        /* create and launch a thread to handle the data transfer */
        HTTPReplySenderThread *t = new HTTPReplySenderThread(this);
        if (!t->launch())
        {
            /* 
             *   the thread failed - post a 'finished' event with an error,
             *   since the thread can't do this on its own if it never runs
             */
            post_done_event(0, "unable to launch thread");
        }

        /* we're done with the thread */
        t->release_ref();
    }